

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::NameResolver::BeginTryTableExpr(NameResolver *this,TryTableExpr *expr)

{
  pointer pTVar1;
  pointer pTVar2;
  Var *pVVar3;
  Var *var;
  
  pTVar1 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar1 != pTVar2) {
    var = &pTVar1->target;
    do {
      if ((var[1].loc.filename._M_len & 0xfffffffe) != 2) {
        ResolveVar(this,&this->current_module_->tag_bindings,var + -1,"tag");
      }
      ResolveLabelVar(this,var);
      pVVar3 = var + 1;
      var = (Var *)&var[2].field_2;
    } while ((pointer)&(pVVar3->loc).filename._M_str != pTVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->labels_,&(expr->block).label);
  if ((expr->block).decl.has_func_type == true) {
    ResolveVar(this,&this->current_module_->type_bindings,&(expr->block).decl.type_var,"type");
  }
  return (Result)Ok;
}

Assistant:

Result NameResolver::BeginTryTableExpr(TryTableExpr* expr) {
  for (TableCatch& catch_ : expr->catches) {
    if (!catch_.IsCatchAll()) {
      ResolveTagVar(&catch_.tag);
    }
    ResolveLabelVar(&catch_.target);
  }
  PushLabel(expr->block.label);
  ResolveBlockDeclarationVar(&expr->block.decl);
  return Result::Ok;
}